

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O2

void spr_write_booke_pid(DisasContext_conflict10 *ctx,int sprn,int gprn)

{
  TCGContext_conflict10 *tcg_ctx;
  uintptr_t o;
  TCGv_i32 pTVar1;
  TCGTemp *local_38;
  TCGTemp *local_30;
  TCGv_i64 local_28;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  pTVar1 = tcg_const_i32_ppc64(tcg_ctx,sprn);
  local_38 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
  local_28 = (TCGv_i64)((long)&tcg_ctx->pool_cur + (long)cpu_gpr[gprn]);
  local_30 = (TCGTemp *)(pTVar1 + (long)tcg_ctx);
  tcg_gen_callN_ppc64(tcg_ctx,helper_booke_setpid_ppc64,(TCGTemp *)0x0,3,&local_38);
  tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
  return;
}

Assistant:

static void spr_write_booke_pid(DisasContext *ctx, int sprn, int gprn)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i32 t0 = tcg_const_i32(tcg_ctx, sprn);
    gen_helper_booke_setpid(tcg_ctx, tcg_ctx->cpu_env, t0, cpu_gpr[gprn]);
    tcg_temp_free_i32(tcg_ctx, t0);
}